

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::numberToString(Kvm *vm,Value *args)

{
  Value *pVVar1;
  Value *pVVar2;
  string local_40;
  long local_20;
  long n;
  Value *args_local;
  Kvm *vm_local;
  
  n = (long)args;
  args_local = (Value *)vm;
  pVVar1 = car(args);
  pVVar2 = args_local;
  local_20 = (long)pVVar1 >> 1;
  std::__cxx11::to_string(&local_40,local_20);
  pVVar2 = makeString((Kvm *)pVVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return pVVar2;
}

Assistant:

const Value* Kvm::numberToString(Kvm *vm, const Value *args)
{
    long n = TK_INT(car(args));
    return vm->makeString(std::to_string(n));
}